

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadmap.cpp
# Opt level: O1

char * lm_addr_to_module(void *addr)

{
  FILE *__stream;
  __ssize_t _Var1;
  char *pcVar2;
  char *line;
  size_t len;
  lm_seg_t s;
  char *local_1088;
  size_t local_1080;
  lm_seg_t local_1078;
  
  local_1088 = (char *)0x0;
  local_1080 = 0;
  __stream = fopen("/proc/self/maps","r");
  do {
    _Var1 = getline(&local_1088,&local_1080,__stream);
    if (_Var1 == -1) {
      return (char *)0x0;
    }
    lm_segment_parse(&local_1078,local_1088);
  } while (local_1078.end_address <= addr || addr < local_1078.start_address);
  pcVar2 = strdup(local_1078.path);
  return pcVar2;
}

Assistant:

const char *
lm_addr_to_module
(
  void *addr
)
{
  char *line = NULL;
  size_t len = 0;

  FILE* loadmap = fopen("/proc/self/maps", "r");

  for(; getline(&line, &len, loadmap) != -1;) {
    lm_seg_t s;
    lm_segment_parse(&s, line);
    if (lm_segment_contains(&s, addr)) return strdup(lm_segment_path(&s));
  }
  return NULL;
}